

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgExpression.cpp
# Opt level: O2

Expression * __thiscall
rsg::ConstructorOp::createNextChild(ConstructorOp *this,GeneratorState *state)

{
  pointer pVVar1;
  ConstValueRangeAccess valueRange;
  int iVar2;
  long lVar3;
  ulong uVar4;
  Expression *local_28;
  long local_20;
  Scalar *pSStack_18;
  Scalar *local_10;
  
  pVVar1 = (this->m_inputValueRanges).
           super__Vector_base<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->m_inputValueRanges).
                super__Vector_base<rsg::ValueRange,_std::allocator<rsg::ValueRange>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pVVar1;
  iVar2 = (int)((ulong)((long)(this->m_inputExpressions).
                              super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->m_inputExpressions).
                             super__Vector_base<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3);
  if (iVar2 < (int)(uVar4 >> 7)) {
    lVar3 = ~(long)iVar2 * 0x80;
    pSStack_18 = *(Scalar **)((long)pVVar1 + lVar3 + 0x50 + uVar4);
    local_10 = *(Scalar **)((long)pVVar1 + lVar3 + 0x68 + uVar4);
    if (pSStack_18 == *(Scalar **)((long)pVVar1 + lVar3 + 0x58 + uVar4)) {
      pSStack_18 = (Scalar *)0x0;
    }
    if (local_10 == *(Scalar **)((long)pVVar1 + lVar3 + 0x70 + uVar4)) {
      local_10 = (Scalar *)0x0;
    }
    local_20 = (long)pVVar1 + lVar3 + uVar4;
    valueRange.m_min = pSStack_18;
    valueRange.m_type = (VariableType *)local_20;
    valueRange.m_max = local_10;
    local_28 = Expression::createRandom(state,valueRange);
    std::vector<rsg::Expression_*,_std::allocator<rsg::Expression_*>_>::push_back
              (&this->m_inputExpressions,&local_28);
  }
  else {
    local_28 = (Expression *)0x0;
  }
  return local_28;
}

Assistant:

Expression* ConstructorOp::createNextChild (GeneratorState& state)
{
	int					numChildren	= (int)m_inputExpressions.size();
	Expression*			child		= DE_NULL;

	// \note Created in reverse order!
	if (numChildren < (int)m_inputValueRanges.size())
	{
		const ValueRange& inValueRange = m_inputValueRanges[m_inputValueRanges.size()-1-numChildren];
		child = Expression::createRandom(state, inValueRange);
		try
		{
			m_inputExpressions.push_back(child);
		}
		catch (const std::exception&)
		{
			delete child;
			throw;
		}
	}

	return child;
}